

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::format_handler<char>::on_format_specs
          (format_handler<char> *this,int id,char *begin,char *end)

{
  buffered_context<char> *ctx;
  appender out;
  locale_ref loc;
  loc_value value;
  loc_value value_00;
  loc_value value_01;
  loc_value value_02;
  loc_value value_03;
  loc_value value_04;
  write_int_arg<unsigned___int128> arg_00;
  basic_appender<char> out_00;
  basic_appender<char> out_01;
  format_specs specs;
  basic_appender<char> out_02;
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  write_int_arg<unsigned_int> arg_01;
  basic_appender<char> out_03;
  locale_ref loc_00;
  uint32_or_64_or_128_t<long_long> abs_value;
  basic_appender<char> bVar6;
  basic_string_view<char> s;
  format_specs specs_00;
  write_int_arg<unsigned_long> arg_02;
  format_specs specs_01;
  basic_format_arg<fmt::v11::context> arg;
  undefined2 uVar7;
  undefined6 uVar8;
  dynamic_format_specs<char> local_c8;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_98;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_78;
  type local_68;
  long local_58;
  long lStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  ctx = &this->ctx;
  get_arg<fmt::v11::context,int>
            ((basic_format_arg<fmt::v11::context> *)&local_78.string,(detail *)ctx,
             (context *)(ulong)(uint)id,(int)end);
  bVar2 = basic_format_arg<fmt::v11::context>::format_custom
                    ((basic_format_arg<fmt::v11::context> *)&local_78.string,begin,&this->parse_ctx,
                     ctx);
  if (bVar2) {
    return (this->parse_ctx).fmt_.data_;
  }
  local_c8.precision_ref.name.size_ = 0;
  local_c8.width_ref.name.data_ = (char *)0x0;
  local_c8.width_ref.name.size_ = 0;
  local_c8.super_format_specs.super_basic_specs.data_._0_1_ = 0;
  local_c8.super_format_specs.super_basic_specs.data_._1_1_ = 0x80;
  local_c8.super_format_specs.super_basic_specs.data_._2_2_ = 0;
  local_c8.super_format_specs._9_7_ = 0xffffffff000000;
  local_c8.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_c8.super_format_specs.super_basic_specs.fill_data_[1] = '\0';
  local_c8.super_format_specs.super_basic_specs.fill_data_[2] = '\0';
  local_c8.super_format_specs.super_basic_specs.fill_data_[3] = '\0';
  local_c8.super_format_specs.width._0_1_ = 0;
  local_c8.precision_ref.name.data_ = (char *)0x0;
  loc_00.locale_ = (void *)(ulong)local_68;
  pcVar4 = parse_format_specs<char>(begin,end,&local_c8,&this->parse_ctx,local_68);
  if ((CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                (undefined1)local_c8.super_format_specs.super_basic_specs.data_) & 0x3c0) != 0) {
    handle_dynamic_spec<fmt::v11::context>
              ((CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                         (undefined1)local_c8.super_format_specs.super_basic_specs.data_) & 0xc0) >>
               6,&local_c8.super_format_specs.width,&local_c8.width_ref,ctx);
    handle_dynamic_spec<fmt::v11::context>
              ((CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                         (undefined1)local_c8.super_format_specs.super_basic_specs.data_) & 0x300)
               >> 8,&local_c8.super_format_specs.precision,&local_c8.precision_ref,ctx);
  }
  if (0xd < local_68 - int_type) {
    return pcVar4;
  }
  out.container = (this->ctx).out_.container;
  loc.locale_ = (this->ctx).loc_.locale_;
  uVar7 = (undefined2)local_98._8_8_;
  uVar8 = (undefined6)((ulong)local_98._8_8_ >> 0x10);
  switch(local_68) {
  case int_type:
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_98.int_value = local_78.int_value;
      local_88 = 1;
      value.value_._20_4_ = uStack_84;
      value.value_.type_ = 1;
      value.value_.value_.field_0.int128_value._8_2_ = uVar7;
      value.value_.value_.field_0.long_long_value = local_98._0_8_;
      value.value_.value_.field_0.int128_value._10_6_ = uVar8;
      value.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
    }
    if (local_78.int_value < 0) {
      local_78.int_value = -local_78.int_value;
      uVar5 = 0x100002d00000000;
    }
    else {
      uVar5 = (ulong)*(uint *)((long)&DAT_001836d0 +
                              (ulong)((CONCAT11(local_c8.super_format_specs.super_basic_specs.data_.
                                                _1_1_,(undefined1)
                                                      local_c8.super_format_specs.super_basic_specs.
                                                      data_) & 0xc00) >> 8)) << 0x20;
    }
    arg_01 = (write_int_arg<unsigned_int>)(local_78.uint_value | uVar5);
    goto LAB_0017d53d;
  case uint_type:
    uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_98.int_value = local_78.int_value;
      local_88 = 2;
      value_03.value_._20_4_ = uStack_84;
      value_03.value_.type_ = 2;
      value_03.value_.value_.field_0.int128_value._8_2_ = uVar7;
      value_03.value_.value_.field_0.long_long_value = local_98._0_8_;
      value_03.value_.value_.field_0.int128_value._10_6_ = uVar8;
      value_03.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value_03,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
      uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    }
    arg_01.prefix = *(uint *)((long)&DAT_001836d0 + (ulong)(uVar3 >> 8 & 0xc));
    arg_01.abs_value = local_78.int_value;
LAB_0017d53d:
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
              ((basic_appender<char>)out.container,arg_01,&local_c8.super_format_specs);
    break;
  case long_long_type:
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_88 = 3;
      value_01.value_._20_4_ = uStack_84;
      value_01.value_.type_ = 3;
      value_01.value_.value_.field_0.int128_value._8_2_ = uVar7;
      value_01.value_.value_.field_0.long_long_value =
           CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
      value_01.value_.value_.field_0.int128_value._10_6_ = uVar8;
      value_01.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value_01,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
    }
    if (-1 < local_78._4_4_) {
LAB_0017d375:
      uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
      goto LAB_0017d379;
    }
    bVar6.container = (buffer<char> *)-CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar5 = 0x100002d;
    goto LAB_0017d389;
  case ulong_long_type:
    value_02.value_.value_.field_0.long_long_value._4_4_ = local_78.long_long_value._4_4_;
    value_02.value_.value_.field_0.int_value = local_78.int_value;
    uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_88 = 4;
      value_02.value_._20_4_ = uStack_84;
      value_02.value_.type_ = 4;
      value_02.value_.value_.field_0.int128_value._8_2_ = uVar7;
      value_02.value_.value_.field_0.int128_value._10_6_ = uVar8;
      value_02.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value_02,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
      goto LAB_0017d375;
    }
LAB_0017d379:
    bVar6.container = (buffer<char> *)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar5 = (ulong)*(uint *)((long)&DAT_001836d0 + (ulong)(uVar3 >> 8 & 0xc));
LAB_0017d389:
    arg_02._8_8_ = &local_c8;
    arg_02.abs_value = uVar5;
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_long>
              ((detail *)out.container,bVar6,arg_02,(format_specs *)loc_00.locale_);
    break;
  case int128_type:
    lVar1 = CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_88 = 5;
      value_00.value_._20_4_ = uStack_84;
      value_00.value_.type_ = 5;
      value_00.value_.value_.field_0.int128_value._8_2_ = local_78.int128_value._8_2_;
      value_00.value_.value_.field_0.long_long_value = lVar1;
      value_00.value_.value_.field_0.int128_value._10_6_ = local_78.int128_value._10_6_;
      value_00.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value_00,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
      uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    }
    if (-1 < local_78._10_6_) goto LAB_0017d471;
    local_58 = -lVar1;
    lStack_50 = -(ulong)(lVar1 != 0) -
                CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_);
    local_48 = 0x100002d;
    goto LAB_0017d481;
  case uint128_type:
    value_04.value_.value_.field_0.long_long_value._4_4_ = local_78.long_long_value._4_4_;
    value_04.value_.value_.field_0.int_value = local_78.int_value;
    uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                     CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                              (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    if ((local_c8.super_format_specs.super_basic_specs.data_._1_1_ & 0x40) != 0) {
      local_88 = 6;
      value_04.value_._20_4_ = uStack_84;
      value_04.value_.type_ = 6;
      value_04.value_.value_.field_0.int128_value._8_2_ = local_78.int128_value._8_2_;
      value_04.value_.value_.field_0.int128_value._10_6_ = local_78.int128_value._10_6_;
      value_04.value_._24_8_ = uStack_80;
      bVar2 = write_loc(out,value_04,&local_c8.super_format_specs,loc);
      if (bVar2) {
        return pcVar4;
      }
      uVar3 = CONCAT22(local_c8.super_format_specs.super_basic_specs.data_._2_2_,
                       CONCAT11(local_c8.super_format_specs.super_basic_specs.data_._1_1_,
                                (undefined1)local_c8.super_format_specs.super_basic_specs.data_));
    }
LAB_0017d471:
    local_58 = CONCAT44(local_78.long_long_value._4_4_,local_78.int_value);
    lStack_50 = CONCAT62(local_78.int128_value._10_6_,local_78.int128_value._8_2_);
    local_48 = *(undefined4 *)((long)&DAT_001836d0 + (ulong)(uVar3 >> 8 & 0xc));
LAB_0017d481:
    arg_00._20_4_ = uStack_44;
    arg_00.prefix = local_48;
    arg_00.abs_value._8_2_ = (short)lStack_50;
    arg_00.abs_value._0_8_ = local_58;
    arg_00.abs_value._10_6_ = (int6)((ulong)lStack_50 >> 0x10);
    arg_00._24_8_ = uStack_40;
    write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned__int128>
              ((basic_appender<char>)out.container,arg_00,&local_c8.super_format_specs);
    break;
  case bool_type:
    out_03.container._1_7_ = 0;
    out_03.container._0_1_ = local_78.bool_value;
    write<char,_fmt::v11::basic_appender<char>,_bool,_0>
              ((detail *)out.container,out_03,SUB81(&local_c8,0),(format_specs *)loc.locale_,loc_00)
    ;
    break;
  case char_type:
    write<char,fmt::v11::basic_appender<char>>
              ((basic_appender<char>)out.container,local_78.char_value,&local_c8.super_format_specs,
               loc);
    break;
  case float_type:
    out_01.container._1_1_ = local_c8.super_format_specs.super_basic_specs.data_._1_1_;
    out_01.container._0_1_ = (undefined1)local_c8.super_format_specs.super_basic_specs.data_;
    out_01.container._2_2_ = local_c8.super_format_specs.super_basic_specs.data_._2_2_;
    out_01.container._4_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[0];
    out_01.container._5_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[1];
    out_01.container._6_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[2];
    out_01.container._7_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[3];
    specs_01.super_basic_specs._1_7_ = local_c8.super_format_specs._9_7_;
    specs_01.super_basic_specs.data_._0_1_ = (undefined1)local_c8.super_format_specs.width;
    specs_01._8_8_ = loc.locale_;
    write<char,_fmt::v11::basic_appender<char>,_float,_0>
              ((detail *)out.container,out_01,local_78.float_value,specs_01,loc_00);
    break;
  case double_type:
    out_00.container._1_1_ = local_c8.super_format_specs.super_basic_specs.data_._1_1_;
    out_00.container._0_1_ = (undefined1)local_c8.super_format_specs.super_basic_specs.data_;
    out_00.container._2_2_ = local_c8.super_format_specs.super_basic_specs.data_._2_2_;
    out_00.container._4_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[0];
    out_00.container._5_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[1];
    out_00.container._6_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[2];
    out_00.container._7_1_ = local_c8.super_format_specs.super_basic_specs.fill_data_[3];
    specs_00.super_basic_specs._1_7_ = local_c8.super_format_specs._9_7_;
    specs_00.super_basic_specs.data_._0_1_ = (undefined1)local_c8.super_format_specs.width;
    specs_00._8_8_ = loc.locale_;
    write<char,_fmt::v11::basic_appender<char>,_double,_0>
              ((detail *)out.container,out_00,
               (double)CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),specs_00,loc_00);
    break;
  case last_numeric_type:
    specs.super_basic_specs.data_._1_1_ = local_c8.super_format_specs.super_basic_specs.data_._1_1_;
    specs.super_basic_specs.data_._0_1_ =
         (undefined1)local_c8.super_format_specs.super_basic_specs.data_;
    specs.super_basic_specs.data_._2_2_ = local_c8.super_format_specs.super_basic_specs.data_._2_2_;
    specs.super_basic_specs.fill_data_[0] =
         local_c8.super_format_specs.super_basic_specs.fill_data_[0];
    specs.super_basic_specs.fill_data_[1] =
         local_c8.super_format_specs.super_basic_specs.fill_data_[1];
    specs.super_basic_specs.fill_data_[2] =
         local_c8.super_format_specs.super_basic_specs.fill_data_[2];
    specs.super_basic_specs.fill_data_[3] =
         local_c8.super_format_specs.super_basic_specs.fill_data_[3];
    specs.width._0_1_ = (undefined1)local_c8.super_format_specs.width;
    specs._9_7_ = local_c8.super_format_specs._9_7_;
    write<char,_fmt::v11::basic_appender<char>,_long_double,_0>
              ((basic_appender<char>)out.container,
               (longdouble)
               CONCAT28(local_78.int128_value._8_2_,
                        CONCAT44(local_78.long_long_value._4_4_,local_78.int_value)),specs,loc);
    break;
  case cstring_type:
    out_02.container._4_4_ = local_78.long_long_value._4_4_;
    out_02.container._0_4_ = local_78.int_value;
    write<char,fmt::v11::basic_appender<char>>
              ((detail *)out.container,out_02,(char *)&local_c8,(format_specs *)loc.locale_,loc_00);
    break;
  case string_type:
    bVar6.container._4_4_ = local_78.long_long_value._4_4_;
    bVar6.container._0_4_ = local_78.int_value;
    s.data_._2_6_ = local_78.int128_value._10_6_;
    s.data_._0_2_ = local_78.int128_value._8_2_;
    s.size_ = (size_t)&local_c8;
    write<char,fmt::v11::basic_appender<char>>
              ((detail *)out.container,bVar6,s,(format_specs *)loc_00.locale_);
    break;
  case pointer_type:
    write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
              ((basic_appender<char>)out.container,
               CONCAT44(local_78.long_long_value._4_4_,local_78.int_value),
               &local_c8.super_format_specs);
  }
  return pcVar4;
}

Assistant:

auto on_format_specs(int id, const Char* begin, const Char* end)
      -> const Char* {
    auto arg = get_arg(ctx, id);
    // Not using a visitor for custom types gives better codegen.
    if (arg.format_custom(begin, parse_ctx, ctx)) return parse_ctx.begin();

    auto specs = dynamic_format_specs<Char>();
    begin = parse_format_specs(begin, end, specs, parse_ctx, arg.type());
    if (specs.dynamic()) {
      handle_dynamic_spec(specs.dynamic_width(), specs.width, specs.width_ref,
                          ctx);
      handle_dynamic_spec(specs.dynamic_precision(), specs.precision,
                          specs.precision_ref, ctx);
    }

    arg.visit(arg_formatter<Char>{ctx.out(), specs, ctx.locale()});
    return begin;
  }